

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

Am_Type_Support * Am_Find_Support(Am_Value_Type type)

{
  _Rb_tree_header *p_Var1;
  Am_Type_Support *pAVar2;
  undefined8 in_RAX;
  mapped_type *ppAVar3;
  _Base_ptr *pp_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  undefined8 uStack_18;
  
  if (Support_Table == (Am_Map_Support *)0x0) {
    uStack_18 = in_RAX;
    Support_Table = (Am_Map_Support *)operator_new(0x38);
    p_Var1 = &(Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header;
    (Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
    ;
    (Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pAVar2 = type_type_support;
    uStack_18 = CONCAT26(0x4014,(undefined6)uStack_18);
    ppAVar3 = std::
              map<unsigned_short,_Am_Type_Support_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Type_Support_*>_>_>
              ::operator[]((map<unsigned_short,_Am_Type_Support_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Type_Support_*>_>_>
                            *)Support_Table,(key_type_conflict *)((long)&uStack_18 + 6));
    *ppAVar3 = pAVar2;
  }
  p_Var6 = (Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var6 != (_Base_ptr)0x0) {
    p_Var1 = &(Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      bVar7 = (ushort)(short)p_Var6[1]._M_color < type;
      if (!bVar7) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar7];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && ((ushort)(short)p_Var5[1]._M_color <= type)) {
      pp_Var4 = &p_Var5[1]._M_parent;
      goto LAB_0022a680;
    }
  }
  pp_Var4 = (_Base_ptr *)&Support_Table->mDefaultReturn;
LAB_0022a680:
  return (Am_Type_Support *)*pp_Var4;
}

Assistant:

Am_Type_Support *
Am_Find_Support(Am_Value_Type type)
{
  verify_support_table();
  return Support_Table->GetAt(type);
}